

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O1

void gen_swstep_exception(DisasContext_conflict1 *s,int isv,int ex)

{
  int iVar1;
  int val;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  val = s->debug_target_el;
  iVar1 = s->current_el;
  if (iVar1 <= val) {
    tcg_ctx = s->uc->tcg_ctx;
    pTVar2 = tcg_const_i32_aarch64(tcg_ctx,1);
    pTVar3 = tcg_const_i32_aarch64
                       (tcg_ctx,ex << 6 | isv << 0x18 | (uint)(val == iVar1) << 0x1a | 0xca000022);
    pTVar4 = tcg_const_i32_aarch64(tcg_ctx,val);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_30 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_exception_with_syndrome_aarch64,(TCGTemp *)0x0,4,&local_48)
    ;
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    return;
  }
  __assert_fail("s->debug_target_el >= s->current_el",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.h"
                ,0x108,"void gen_swstep_exception(DisasContext *, int, int)");
}

Assistant:

static inline void gen_swstep_exception(DisasContext *s, int isv, int ex)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool same_el = (s->debug_target_el == s->current_el);

    /*
     * If singlestep is targeting a lower EL than the current one,
     * then s->ss_active must be false and we can never get here.
     */
    assert(s->debug_target_el >= s->current_el);

    gen_exception(tcg_ctx, EXCP_UDEF, syn_swstep(same_el, isv, ex), s->debug_target_el);
}